

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_set_infinity(secp256k1_gej *r)

{
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined8 *)((long)(r->x).n + 0x1c) = 0;
  *(undefined8 *)((long)(r->x).n + 0x24) = 0;
  (r->x).normalized = 1;
  secp256k1_fe_verify(&r->x);
  *(undefined8 *)((long)(r->y).n + 0x1c) = 0;
  *(undefined8 *)((long)(r->y).n + 0x24) = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).normalized = 1;
  secp256k1_fe_verify(&r->y);
  *(undefined8 *)((long)(r->z).n + 0x1c) = 0;
  *(undefined8 *)((long)(r->z).n + 0x24) = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).normalized = 1;
  secp256k1_fe_verify(&r->z);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_set_infinity(secp256k1_gej *r) {
    r->infinity = 1;
    secp256k1_fe_set_int(&r->x, 0);
    secp256k1_fe_set_int(&r->y, 0);
    secp256k1_fe_set_int(&r->z, 0);

    SECP256K1_GEJ_VERIFY(r);
}